

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

BoolExpr * BO_and(List *ls)

{
  bool bVar1;
  BoolExpr *pBVar2;
  BoolExpr *pBVar3;
  
  bVar1 = false;
  pBVar2 = create_bool_expr(E_AND,(BoolExpr *)0x0);
  while (ls = ls->cdr, ls != (List *)0x0) {
    pBVar3 = make_boolean_expr(ls);
    if (pBVar3->type == E_FALSE) goto LAB_0010878a;
    if (pBVar3->type == E_TRUE) {
      bVar1 = true;
    }
    else {
      pBVar3->next = pBVar2->subexpr;
      pBVar2->subexpr = pBVar3;
    }
  }
  pBVar3 = pBVar2->subexpr;
  if (pBVar3 == (BoolExpr *)0x0) {
    if (bVar1) {
      pBVar2 = &true_bool_expr;
    }
    else {
      parse_error((List *)0x0,"and takes arguments!\n");
LAB_0010878a:
      pBVar2 = &false_bool_expr;
    }
  }
  else if (pBVar3->next == (BoolExprStruct *)0x0) {
    pBVar2 = pBVar3;
  }
  return pBVar2;
}

Assistant:

static BoolExpr *
BO_and(const List *ls)
{
  BoolExpr *subexpr, *ret;
  BOOL hit_true = FALSE;

  ret = create_bool_expr (E_AND, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_FALSE)  /* If we ever hit FALSE, expr is FALSE */
	return &false_bool_expr;
      if (subexpr->type != E_TRUE)   /* No sense adding in TRUE statements */
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
      else hit_true = TRUE;
    }
  if (ret->subexpr == NULL)
    {
      if (hit_true)   /* If we hit nothing but TRUE's return TRUE */
	return &true_bool_expr;
      parse_error(ls, "and takes arguments!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (and a) == a */
    return ret->subexpr;   
  
  return ret;
}